

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_test.cc
# Opt level: O1

void __thiscall
(anonymous_namespace)::____C_A_T_C_H____T_E_S_T____24::test()::EntityDestroyedEventReceiver::
receive(entityx::EntityDestroyedEvent_const__(void *this,EntityDestroyedEvent *event)

{
  iterator __position;
  uint64_t uVar1;
  
  __position._M_current = *(Entity **)((long)this + 0x48);
  if (__position._M_current != *(Entity **)((long)this + 0x50)) {
    uVar1 = *(uint64_t *)(event + 0x10);
    (__position._M_current)->manager_ = ((Entity *)(event + 8))->manager_;
    ((__position._M_current)->id_).id_ = uVar1;
    *(long *)((long)this + 0x48) = *(long *)((long)this + 0x48) + 0x10;
    return;
  }
  std::vector<entityx::Entity,std::allocator<entityx::Entity>>::
  _M_realloc_insert<entityx::Entity_const&>
            ((vector<entityx::Entity,std::allocator<entityx::Entity>> *)((long)this + 0x40),
             __position,(Entity *)(event + 8));
  return;
}

Assistant:

void receive(const EntityDestroyedEvent &event) {
      destroyed.push_back(event.entity);
    }